

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_4::drawGLES2(Functions *gl,Program *program,DrawPrimitiveOp *drawOp)

{
  BlendMode BVar1;
  long lVar2;
  long lVar3;
  GLenum GVar4;
  GLenum GVar5;
  
  lVar2 = __dynamic_cast(program,&egl::(anonymous_namespace)::Program::typeinfo,
                         &egl::(anonymous_namespace)::GLES2Program::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  BVar1 = drawOp->blend;
  if (BVar1 == BLENDMODE_SRC_OVER) {
    (*gl->enable)(0xbe2);
    GVar5 = 0x302;
    GVar4 = 0x303;
LAB_00e82610:
    (*gl->blendFunc)(GVar5,GVar4);
  }
  else {
    if (BVar1 == BLENDMODE_ADDITIVE) {
      (*gl->enable)(0xbe2);
      GVar5 = 1;
      GVar4 = 1;
      goto LAB_00e82610;
    }
    if (BVar1 == BLENDMODE_NONE) {
      (*gl->disable)(0xbe2);
    }
  }
  if (drawOp->depth == DEPTHMODE_NONE) {
    lVar3 = 0x4e8;
  }
  else {
    if (drawOp->depth != DEPTHMODE_LESS) goto LAB_00e82638;
    lVar3 = 0x5e0;
  }
  (**(code **)((long)&gl->activeShaderProgram + lVar3))(0xb71);
LAB_00e82638:
  if (drawOp->stencil == STENCILMODE_LEQUAL_INC) {
    (*gl->enable)(0xb90);
    (*gl->stencilFunc)(0x203,drawOp->stencilRef,0xffffffff);
    (*gl->stencilOp)(0x1e00,0x1e02,0x1e02);
  }
  else if (drawOp->stencil == STENCILMODE_NONE) {
    (*gl->disable)(0xb90);
  }
  (*gl->disable)(0xbd0);
  (*gl->vertexAttribPointer)
            (*(GLuint *)(lVar2 + 0xe0),4,0x1406,'\0',0,
             (drawOp->positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*gl->vertexAttribPointer)
            (*(GLuint *)(lVar2 + 0xe4),4,0x1406,'\0',0,
             (drawOp->colors).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*gl->drawArrays)(4,0,drawOp->count * 3);
  return;
}

Assistant:

void drawGLES2 (const glw::Functions& gl, const Program& program, const DrawPrimitiveOp& drawOp)
{
	const GLES2Program& gles2Program = dynamic_cast<const GLES2Program&>(program);

	switch (drawOp.blend)
	{
		case BLENDMODE_NONE:
			gl.disable(GL_BLEND);
			break;

		case BLENDMODE_ADDITIVE:
			gl.enable(GL_BLEND);
			gl.blendFunc(GL_ONE, GL_ONE);
			break;

		case BLENDMODE_SRC_OVER:
			gl.enable(GL_BLEND);
			gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
			break;

		default:
			DE_ASSERT(false);
	}

	switch (drawOp.depth)
	{
		case DEPTHMODE_NONE:
			gl.disable(GL_DEPTH_TEST);
			break;

		case DEPTHMODE_LESS:
			gl.enable(GL_DEPTH_TEST);
			break;

		default:
			DE_ASSERT(false);
	}

	switch (drawOp.stencil)
	{
		case STENCILMODE_NONE:
			gl.disable(GL_STENCIL_TEST);
			break;

		case STENCILMODE_LEQUAL_INC:
			gl.enable(GL_STENCIL_TEST);
			gl.stencilFunc(GL_LEQUAL, drawOp.stencilRef, ~0u);
			gl.stencilOp(GL_KEEP, GL_INCR, GL_INCR);
			break;

		default:
			DE_ASSERT(false);
	}

	gl.disable(GL_DITHER);

	gl.vertexAttribPointer(gles2Program.getPositionLoc(), 4, GL_FLOAT, GL_FALSE, 0, &drawOp.positions[0]);
	gl.vertexAttribPointer(gles2Program.getColorLoc(), 4, GL_FLOAT, GL_FALSE, 0, &drawOp.colors[0]);

	DE_ASSERT(drawOp.type == PRIMITIVETYPE_TRIANGLE);
	gl.drawArrays(GL_TRIANGLES, 0, drawOp.count*3);
}